

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall
TApp_OrderedModifingTransforms_Test::~TApp_OrderedModifingTransforms_Test
          (TApp_OrderedModifingTransforms_Test *this)

{
  TApp_OrderedModifingTransforms_Test *this_local;
  
  ~TApp_OrderedModifingTransforms_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, OrderedModifingTransforms) {
    std::vector<std::string> val;
    auto m = app.add_option("-m", val);
    m->transform([](std::string x) { return x + "1"; });
    m->transform([](std::string x) { return x + "2"; });

    args = {"-mone", "-mtwo"};

    run();

    EXPECT_EQ(val, std::vector<std::string>({"one12", "two12"}));
}